

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

int __thiscall
BamTools::Internal::BamReaderPrivate::GetReferenceID(BamReaderPrivate *this,string *refName)

{
  bool bVar1;
  reference __x;
  iterator __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  difference_type dVar3;
  size_type sVar4;
  long in_RDI;
  int index;
  const_iterator refEnd;
  const_iterator refIter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  refNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
  local_40;
  __normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
  local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  int local_4;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_30);
  local_38._M_current =
       (RefData *)
       std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::begin
                 ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)(in_RDI + 0x28));
  local_40._M_current =
       (RefData *)
       std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::end
                 ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)(in_RDI + 0x28));
  while (bVar1 = __gnu_cxx::operator!=(&local_38,&local_40), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
          ::operator*(&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_30,&__x->RefName);
    __gnu_cxx::
    __normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
    ::operator++(&local_38);
  }
  _Var2._M_current = &local_30;
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(_Var2._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var2._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)_Var2._M_current);
  _Var2 = std::
          find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                    (in_stack_ffffffffffffff78,_Var2,in_stack_ffffffffffffff68);
  dVar3 = std::
          distance<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__first._M_current,_Var2);
  sVar4 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::size
                    ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                     (in_RDI + 0x28));
  local_4 = (int)dVar3;
  if ((int)dVar3 == (int)sVar4) {
    local_4 = -1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_30);
  return local_4;
}

Assistant:

int BamReaderPrivate::GetReferenceID(const std::string& refName) const
{

    // retrieve names from reference data
    std::vector<std::string> refNames;
    RefVector::const_iterator refIter = m_references.begin();
    RefVector::const_iterator refEnd = m_references.end();
    for (; refIter != refEnd; ++refIter)
        refNames.push_back((*refIter).RefName);

    // return 'index-of' refName (or -1 if not found)
    int index = distance(refNames.begin(), find(refNames.begin(), refNames.end(), refName));
    if (index == (int)m_references.size())
        return -1;
    else
        return index;
}